

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLPrinter::PrepareForNewNode(XMLPrinter *this,bool compactMode)

{
  undefined7 in_register_00000031;
  
  SealElementIfJustOpened(this);
  if ((int)CONCAT71(in_register_00000031,compactMode) != 0) {
    return;
  }
  if (this->_firstElement == false) {
    if (-1 < this->_textDepth) goto LAB_00114769;
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xf])(this,10);
  }
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
LAB_00114769:
  this->_firstElement = false;
  return;
}

Assistant:

void XMLPrinter::PrepareForNewNode( bool compactMode )
{
    SealElementIfJustOpened();

    if ( compactMode ) {
        return;
    }

    if ( _firstElement ) {
        PrintSpace (_depth);
    } else if ( _textDepth < 0) {
        Putc( '\n' );
        PrintSpace( _depth );
    }

    _firstElement = false;
}